

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_nal.c
# Opt level: O3

WORD32 ihevcd_nal_search_start_code(UWORD8 *pu1_buf,WORD32 bytes_remaining)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = 0;
  if (bytes_remaining < 1) {
    uVar5 = 0xffffffff;
  }
  else {
    uVar5 = bytes_remaining - 1;
    uVar2 = 1;
    do {
      uVar3 = 0;
      if (pu1_buf[uVar2 - 1] == '\0') {
        if (pu1_buf[uVar2] == '\x01' && 0 < (int)uVar4) goto LAB_0010f1be;
        uVar3 = uVar4 + 1;
      }
      lVar1 = uVar2 - uVar5;
      uVar2 = uVar2 + 1;
      uVar4 = uVar3;
    } while (lVar1 != 1);
    uVar4 = (uint)(1 < (int)uVar3);
  }
  uVar2 = (ulong)(uVar5 + (pu1_buf[(int)uVar5] == '\x01' & (byte)uVar4));
LAB_0010f1be:
  return (int)uVar2 + 1;
}

Assistant:

WORD32 ihevcd_nal_search_start_code(UWORD8 *pu1_buf, WORD32 bytes_remaining)
{
    WORD32 ofst;

    WORD32 zero_byte_cnt;
    WORD32 start_code_found;

    ofst = -1;

    zero_byte_cnt = 0;
    start_code_found = 0;
    while(ofst < (bytes_remaining - 1))
    {
        ofst++;
        if(pu1_buf[ofst] != 0)
        {
            zero_byte_cnt = 0;
            continue;
        }

        zero_byte_cnt++;
        if((pu1_buf[ofst + 1] == START_CODE_PREFIX_BYTE) &&
           (zero_byte_cnt >= NUM_ZEROS_BEFORE_START_CODE))
        {
            /* Found the start code */
            ofst++;
            start_code_found = 1;
            break;
        }
    }
    if(0 == start_code_found)
    {
        if((START_CODE_PREFIX_BYTE == pu1_buf[ofst]) &&
           (zero_byte_cnt >= NUM_ZEROS_BEFORE_START_CODE))
        {
            /* Found a start code at the end*/
            ofst++;
        }
    }
    /* Since ofst started at -1, increment it by 1 */
    ofst++;

    return ofst;
}